

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

hFILE * hfile_init(size_t struct_size,char *mode,size_t capacity)

{
  hFILE *fp;
  char *pcVar1;
  size_t __size;
  
  fp = (hFILE *)malloc(struct_size);
  if (fp != (hFILE *)0x0) {
    if (capacity == 0) {
      capacity = 0x8000;
    }
    pcVar1 = strchr(mode,0x72);
    __size = 0x8000;
    if (capacity < 0x8000) {
      __size = capacity;
    }
    if (pcVar1 == (char *)0x0) {
      __size = capacity;
    }
    pcVar1 = (char *)malloc(__size);
    fp->buffer = pcVar1;
    if (pcVar1 != (char *)0x0) {
      fp->end = pcVar1;
      fp->begin = pcVar1;
      fp->limit = pcVar1 + __size;
      fp->offset = 0;
      fp->field_0x30 = fp->field_0x30 & 0xfe;
      fp->has_errno = 0;
      return fp;
    }
  }
  hfile_destroy(fp);
  return (hFILE *)0x0;
}

Assistant:

hFILE *hfile_init(size_t struct_size, const char *mode, size_t capacity)
{
    hFILE *fp = (hFILE *) malloc(struct_size);
    if (fp == NULL) goto error;

    if (capacity == 0) capacity = 32768;
    // FIXME For now, clamp input buffer sizes so mpileup doesn't eat memory
    if (strchr(mode, 'r') && capacity > 32768) capacity = 32768;

    fp->buffer = (char *) malloc(capacity);
    if (fp->buffer == NULL) goto error;

    fp->begin = fp->end = fp->buffer;
    fp->limit = &fp->buffer[capacity];

    fp->offset = 0;
    fp->at_eof = 0;
    fp->has_errno = 0;
    return fp;

error:
    hfile_destroy(fp);
    return NULL;
}